

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O2

void __thiscall flow::TargetCodeGenerator::emitLoad(TargetCodeGenerator *this,Value *value)

{
  undefined8 uVar1;
  FlowNumber value_00;
  Opcode OVar2;
  FILE *__stream;
  long lVar3;
  size_t sVar4;
  StackPointer SVar5;
  size_type sVar6;
  long lVar7;
  Operand OVar8;
  Family *pFVar9;
  undefined8 *puVar10;
  Cidr *pCVar11;
  byte bVar12;
  allocator<char> local_71;
  Cidr local_70;
  
  bVar12 = 0;
  if (value == (Value *)0x0) {
LAB_0012ee27:
    SVar5 = getStackPointer(this,value);
    __stream = _stderr;
    if (SVar5 == 0xffffffffffffffff) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "BUG: emitLoad: value not yet on the stack but referenced as operand.",&local_71);
      fprintf(__stream,"%s\n",local_70.ipaddr_._0_8_);
      std::__cxx11::string::~string((string *)&local_70);
      abort();
    }
    sVar6 = std::deque<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>::size
                      (&this->stack_);
    if (SVar5 == sVar6 - 1) {
      return;
    }
    if ((long)(value->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(value->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>.
              _M_impl.super__Vector_impl_data._M_start == 8) {
      emitInstr(this,STACKROT,(Operand)SVar5);
      return;
    }
    emitInstr(this,LOAD,(Operand)SVar5);
    push(this,value);
    return;
  }
  lVar3 = __dynamic_cast(value,&Value::typeinfo,&ConstantValue<long,(flow::LiteralType)2>::typeinfo,
                         0);
  if (lVar3 == 0) {
    lVar3 = __dynamic_cast(value,&Value::typeinfo,
                           &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0);
    if (lVar3 == 0) {
      lVar3 = __dynamic_cast(value,&Value::typeinfo,
                             &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
      if (lVar3 == 0) {
        lVar3 = __dynamic_cast(value,&Value::typeinfo,
                               &ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>::typeinfo,
                               0);
        if (lVar3 == 0) {
          lVar3 = __dynamic_cast(value,&Value::typeinfo,
                                 &ConstantValue<flow::util::Cidr,(flow::LiteralType)6>::typeinfo,0);
          if (lVar3 == 0) {
            lVar3 = __dynamic_cast(value,&Value::typeinfo,&ConstantArray::typeinfo,0);
            if (lVar3 == 0) {
              lVar3 = __dynamic_cast(value,&Value::typeinfo,
                                     &ConstantValue<flow::util::RegExp,(flow::LiteralType)7>::
                                      typeinfo,0);
              if (lVar3 == 0) goto LAB_0012ee27;
              util::RegExp::RegExp((RegExp *)&local_70,(RegExp *)(lVar3 + 0x48));
              sVar4 = ConstantPool::makeRegExp(&this->cp_,(RegExp *)&local_70);
              emitInstr(this,ILOAD,(Operand)sVar4);
              util::RegExp::~RegExp((RegExp *)&local_70);
            }
            else {
              switch(*(undefined4 *)(lVar3 + 8)) {
              case 9:
                convert<long,flow::ConstantValue<long,(flow::LiteralType)2>>
                          ((vector<long,_std::allocator<long>_> *)&local_70,(flow *)(lVar3 + 0x48),
                           (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                           &switchD_0012ed82::switchdataD_0015cad8);
                sVar4 = ConstantPool::makeIntegerArray
                                  (&this->cp_,(vector<long,_std::allocator<long>_> *)&local_70);
                emitInstr(this,ITLOAD,(Operand)sVar4);
                std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                          ((_Vector_base<long,_std::allocator<long>_> *)&local_70);
                break;
              case 10:
                convert<std::__cxx11::string,flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_70,(flow *)(lVar3 + 0x48),
                           (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                           &switchD_0012ed82::switchdataD_0015cad8);
                sVar4 = ConstantPool::makeStringArray
                                  (&this->cp_,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_70);
                emitInstr(this,STLOAD,(Operand)sVar4);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_70);
                break;
              case 0xb:
                convert<flow::util::IPAddress,flow::ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>>
                          ((vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_> *)
                           &local_70,(flow *)(lVar3 + 0x48),
                           (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                           &switchD_0012ed82::switchdataD_0015cad8);
                sVar4 = ConstantPool::makeIPaddrArray
                                  (&this->cp_,
                                   (vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>
                                    *)&local_70);
                emitInstr(this,PTLOAD,(Operand)sVar4);
                std::_Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>::
                ~_Vector_base((_Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>
                               *)&local_70);
                break;
              case 0xc:
                convert<flow::util::Cidr,flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>
                          ((vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)&local_70,
                           (flow *)(lVar3 + 0x48),
                           (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                           &switchD_0012ed82::switchdataD_0015cad8);
                sVar4 = ConstantPool::makeCidrArray
                                  (&this->cp_,
                                   (vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)
                                   &local_70);
                emitInstr(this,CTLOAD,(Operand)sVar4);
                std::_Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>::
                ~_Vector_base((_Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)
                              &local_70);
                break;
              default:
                fwrite("BUG: Unsupported array type in target code generator.",0x35,1,_stderr);
                abort();
              }
            }
            goto LAB_0012ed36;
          }
          puVar10 = (undefined8 *)(lVar3 + 0x48);
          pCVar11 = &local_70;
          for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
            uVar1 = *puVar10;
            (pCVar11->ipaddr_).family_ = (int)uVar1;
            (pCVar11->ipaddr_).cstr_[0] = (char)((ulong)uVar1 >> 0x20);
            (pCVar11->ipaddr_).cstr_[1] = (char)((ulong)uVar1 >> 0x28);
            (pCVar11->ipaddr_).cstr_[2] = (char)((ulong)uVar1 >> 0x30);
            (pCVar11->ipaddr_).cstr_[3] = (char)((ulong)uVar1 >> 0x38);
            puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
            pCVar11 = (Cidr *)((long)pCVar11 + (ulong)bVar12 * -0x10 + 8);
          }
          sVar4 = ConstantPool::makeCidr(&this->cp_,&local_70);
          OVar8 = (Operand)sVar4;
          OVar2 = CLOAD;
        }
        else {
          pFVar9 = (Family *)(lVar3 + 0x48);
          pCVar11 = &local_70;
          for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pCVar11->ipaddr_).family_ = *pFVar9;
            pFVar9 = pFVar9 + (ulong)bVar12 * -2 + 1;
            pCVar11 = (Cidr *)((long)pCVar11 + (ulong)bVar12 * -8 + 4);
          }
          sVar4 = ConstantPool::makeIPAddress(&this->cp_,&local_70.ipaddr_);
          OVar8 = (Operand)sVar4;
          OVar2 = PLOAD;
        }
        emitInstr(this,OVar2,OVar8);
      }
      else {
        std::__cxx11::string::string((string *)&local_70,(string *)(lVar3 + 0x48));
        sVar4 = ConstantPool::makeString(&this->cp_,(string *)&local_70);
        emitInstr(this,SLOAD,(Operand)sVar4);
        std::__cxx11::string::~string((string *)&local_70);
      }
LAB_0012ed36:
      changeStack(this,0,value);
      return;
    }
    OVar8 = (Operand)*(byte *)(lVar3 + 0x48);
  }
  else {
    value_00 = *(FlowNumber *)(lVar3 + 0x48);
    if (0xffff < value_00) {
      sVar4 = ConstantPool::makeInteger(&this->cp_,value_00);
      OVar8 = (Operand)sVar4;
      OVar2 = NLOAD;
      goto LAB_0012ec19;
    }
    OVar8 = (Operand)value_00;
  }
  OVar2 = ILOAD;
LAB_0012ec19:
  emitInstr(this,OVar2,OVar8);
  changeStack(this,0,value);
  return;
}

Assistant:

void TargetCodeGenerator::emitLoad(Value* value) {
  // const int
  if (auto integer = dynamic_cast<ConstantInt*>(value)) {
    // FIXME this constant initialization should pretty much be done in the entry block
    FlowNumber number = integer->get();
    if (number <= std::numeric_limits<Operand>::max()) {
      emitInstr(Opcode::ILOAD, number);
      changeStack(0, value);
    } else {
      emitInstr(Opcode::NLOAD, cp_.makeInteger(number));
      changeStack(0, value);
    }
    return;
  }

  // const boolean
  if (auto boolean = dynamic_cast<ConstantBoolean*>(value)) {
    emitInstr(Opcode::ILOAD, boolean->get());
    changeStack(0, value);
    return;
  }

  // const string
  if (auto str = dynamic_cast<ConstantString*>(value)) {
    emitInstr(Opcode::SLOAD, cp_.makeString(str->get()));
    changeStack(0, value);
    return;
  }

  // const ip
  if (auto ip = dynamic_cast<ConstantIP*>(value)) {
    emitInstr(Opcode::PLOAD, cp_.makeIPAddress(ip->get()));
    changeStack(0, value);
    return;
  }

  // const cidr
  if (auto cidr = dynamic_cast<ConstantCidr*>(value)) {
    emitInstr(Opcode::CLOAD, cp_.makeCidr(cidr->get()));
    changeStack(0, value);
    return;
  }

  // const array<T>
  if (auto array = dynamic_cast<ConstantArray*>(value)) {
    switch (array->type()) {
      case LiteralType::IntArray:
        emitInstr(Opcode::ITLOAD,
             cp_.makeIntegerArray(
                 convert<FlowNumber, ConstantInt>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::StringArray:
        emitInstr(Opcode::STLOAD,
             cp_.makeStringArray(
                 convert<std::string, ConstantString>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::IPAddrArray:
        emitInstr(Opcode::PTLOAD,
             cp_.makeIPaddrArray(convert<util::IPAddress, ConstantIP>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::CidrArray:
        emitInstr(Opcode::CTLOAD,
             cp_.makeCidrArray(convert<util::Cidr, ConstantCidr>(array->get())));
        changeStack(0, value);
        break;
      default:
        fprintf(stderr, "BUG: Unsupported array type in target code generator.");
        abort();
    }
    return;
  }

  // const regex
  if (auto re = dynamic_cast<ConstantRegExp*>(value)) {
    // TODO emitInstr(Opcode::RLOAD, re->get());
    emitInstr(Opcode::ILOAD, cp_.makeRegExp(re->get()));
    changeStack(0, value);
    return;
  }

  // if value is already on stack, dup to top
  StackPointer si = getStackPointer(value);
  FLOW_ASSERT(si != static_cast<size_t>(-1),
              "BUG: emitLoad: value not yet on the stack but referenced as operand.");

  if (si == getStackPointer() - 1)
    return;

  if (value->useCount() == 1) {
    // XXX only used once, so move value to stack top
    emitInstr(Opcode::STACKROT, si);
    return;
  }

  // XXX duplicate value onto stack top
  emitInstr(Opcode::LOAD, si);
  push(value);
}